

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashMap.h
# Opt level: O2

void __thiscall cbtHashString::cbtHashString(cbtHashString *this,char *name)

{
  uint hash;
  uint uVar1;
  char *pcVar2;
  allocator local_9;
  
  std::__cxx11::string::string((string *)this,name,&local_9);
  uVar1 = 0x811c9dc5;
  for (pcVar2 = (this->m_string1)._M_dataplus._M_p; *pcVar2 != '\0'; pcVar2 = pcVar2 + 1) {
    uVar1 = (uVar1 ^ (int)*pcVar2) * 0x1000193;
  }
  this->m_hash = uVar1;
  return;
}

Assistant:

cbtHashString(const char* name)
		: m_string1(name)
	{
		/* magic numbers from http://www.isthe.com/chongo/tech/comp/fnv/ */
		static const unsigned int InitialFNV = 2166136261u;
		static const unsigned int FNVMultiple = 16777619u;

		/* Fowler / Noll / Vo (FNV) Hash */
		unsigned int hash = InitialFNV;

		for (int i = 0; m_string1.c_str()[i]; i++)
		{
			hash = hash ^ (m_string1.c_str()[i]); /* xor  the low 8 bits */
			hash = hash * FNVMultiple;            /* multiply by the magic number */
		}
		m_hash = hash;
	}